

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.cpp
# Opt level: O2

shared_ptr<dlib::timer_global_clock> dlib::get_global_clock(void)

{
  int iVar1;
  timer_global_clock *this;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  shared_ptr<dlib::timer_global_clock> sVar2;
  
  if (get_global_clock()::d == '\0') {
    iVar1 = __cxa_guard_acquire(&get_global_clock()::d);
    if (iVar1 != 0) {
      this = (timer_global_clock *)operator_new(0x168);
      timer_global_clock::timer_global_clock(this);
      std::__shared_ptr<dlib::timer_global_clock,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<dlib::timer_global_clock,void>
                ((__shared_ptr<dlib::timer_global_clock,(__gnu_cxx::_Lock_policy)2> *)
                 &get_global_clock::d,this);
      __cxa_atexit(std::__shared_ptr<dlib::timer_global_clock,_(__gnu_cxx::_Lock_policy)2>::
                   ~__shared_ptr,&get_global_clock::d,&__dso_handle);
      __cxa_guard_release(&get_global_clock()::d);
    }
  }
  std::__shared_ptr<dlib::timer_global_clock,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<dlib::timer_global_clock,_(__gnu_cxx::_Lock_policy)2> *)in_RDI,
             &get_global_clock::d.
              super___shared_ptr<dlib::timer_global_clock,_(__gnu_cxx::_Lock_policy)2>);
  sVar2.super___shared_ptr<dlib::timer_global_clock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar2.super___shared_ptr<dlib::timer_global_clock,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<dlib::timer_global_clock>)
         sVar2.super___shared_ptr<dlib::timer_global_clock,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<timer_global_clock> get_global_clock()
    {
        static std::shared_ptr<timer_global_clock> d(new timer_global_clock);
        return d;
    }